

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O1

void av1_cyclic_reset_segment_skip
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  _Bool _Var1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  MB_MODE_INFO *pMVar5;
  CYCLIC_REFRESH *pCVar6;
  uint8_t *puVar7;
  ulong uVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  undefined7 in_register_00000081;
  uint uVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  size_t __n;
  int iVar16;
  
  pMVar5 = *(x->e_mbd).mi;
  uVar2 = *(ushort *)&pMVar5->field_0xa7;
  uVar10 = uVar2 & 7;
  pCVar6 = cpi->cyclic_refresh;
  uVar8 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  uVar12 = (cpi->common).mi_params.mi_cols - mi_col;
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar8]
      <= (int)uVar12) {
    uVar12 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar8];
  }
  uVar11 = (cpi->common).mi_params.mi_rows - mi_row;
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar8]
      <= (int)uVar11) {
    uVar11 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar8];
  }
  if (pCVar6->skip_over4x4 == 0) {
    iVar3 = (x->e_mbd).mi_row;
    iVar16 = (x->e_mbd).mi_col;
    puVar7 = ((cpi->common).cur_frame)->seg_map;
    _Var1 = (x->e_mbd).up_available;
    bVar9 = 0xff;
    if ((((_Var1 == true) && ((x->e_mbd).left_available == true)) &&
        (bVar9 = 8, iVar3 <= (cpi->common).mi_params.mi_rows)) &&
       (iVar4 = (cpi->common).mi_params.mi_cols, iVar16 <= iVar4)) {
      bVar9 = 8;
      if (puVar7[iVar4 * (iVar3 + -1) + iVar16 + -1] < 8) {
        bVar9 = puVar7[iVar4 * (iVar3 + -1) + iVar16 + -1];
      }
    }
    bVar13 = 0xff;
    if (((_Var1 != false) && (bVar13 = 8, iVar3 <= (cpi->common).mi_params.mi_rows)) &&
       (iVar4 = (cpi->common).mi_params.mi_cols, iVar16 < iVar4)) {
      bVar13 = 8;
      if (puVar7[iVar4 * (iVar3 + -1) + iVar16] < 8) {
        bVar13 = puVar7[iVar4 * (iVar3 + -1) + iVar16];
      }
    }
    bVar15 = 0xff;
    if ((((x->e_mbd).left_available == true) &&
        (bVar15 = 8, iVar3 < (cpi->common).mi_params.mi_rows)) &&
       (iVar4 = (cpi->common).mi_params.mi_cols, iVar16 <= iVar4)) {
      bVar15 = 8;
      if (puVar7[iVar4 * iVar3 + iVar16 + -1] < 8) {
        bVar15 = puVar7[iVar4 * iVar3 + iVar16 + -1];
      }
    }
    if (bVar13 == 0xff) {
      bVar14 = 0;
      if (bVar15 != 0xff) {
        bVar14 = bVar15;
      }
    }
    else {
      bVar14 = bVar13;
      if ((bVar15 != 0xff) && (bVar14 = bVar15, bVar9 == bVar13)) {
        bVar14 = bVar13;
      }
    }
    bVar14 = bVar14 & 7;
    *(ushort *)&pMVar5->field_0xa7 = uVar2 & 0xfff8 | (ushort)bVar14;
    if ((uVar10 != bVar14) && (0 < (int)uVar11)) {
      iVar3 = (cpi->common).mi_params.mi_cols;
      __n = (size_t)(int)uVar12;
      uVar8 = (ulong)uVar11;
      iVar16 = mi_col + mi_row * iVar3;
      do {
        memset(pCVar6->map + iVar16,0,__n);
        memset((cpi->enc_seg).map + iVar16,(uint)bVar14,__n);
        memset(((cpi->common).cur_frame)->seg_map + iVar16,(uint)bVar14,__n);
        iVar16 = iVar16 + iVar3;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  if (dry_run == '\0') {
    if (uVar10 == 2) {
      x->actual_num_seg2_blocks = x->actual_num_seg2_blocks - uVar11 * uVar12;
    }
    else if (uVar10 == 1) {
      x->actual_num_seg1_blocks = x->actual_num_seg1_blocks - uVar11 * uVar12;
    }
  }
  return;
}

Assistant:

void av1_cyclic_reset_segment_skip(const AV1_COMP *cpi, MACROBLOCK *const x,
                                   int mi_row, int mi_col, BLOCK_SIZE bsize,
                                   RUN_TYPE dry_run) {
  int cdf_num;
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int prev_segment_id = mbmi->segment_id;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, bw);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);

  assert(cm->seg.enabled);

  if (!cr->skip_over4x4) {
    mbmi->segment_id =
        av1_get_spatial_seg_pred(cm, xd, &cdf_num, cr->skip_over4x4);
    if (prev_segment_id != mbmi->segment_id) {
      const int block_index = mi_row * cm->mi_params.mi_cols + mi_col;
      const int mi_stride = cm->mi_params.mi_cols;
      const uint8_t segment_id = mbmi->segment_id;
      for (int mi_y = 0; mi_y < ymis; mi_y++) {
        const int map_offset = block_index + mi_y * mi_stride;
        memset(&cr->map[map_offset], 0, xmis);
        memset(&cpi->enc_seg.map[map_offset], segment_id, xmis);
        memset(&cm->cur_frame->seg_map[map_offset], segment_id, xmis);
      }
    }
  }
  if (!dry_run) {
    if (cyclic_refresh_segment_id(prev_segment_id) == CR_SEGMENT_ID_BOOST1)
      x->actual_num_seg1_blocks -= xmis * ymis;
    else if (cyclic_refresh_segment_id(prev_segment_id) == CR_SEGMENT_ID_BOOST2)
      x->actual_num_seg2_blocks -= xmis * ymis;
  }
}